

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int recomputeColumnsUsedExpr(Walker *pWalker,Expr *pExpr)

{
  long lVar1;
  Bitmask BVar2;
  Expr *in_RSI;
  long in_RDI;
  SrcItem *pItem;
  
  if (((in_RSI->op == 0xa8) &&
      (lVar1 = *(long *)(in_RDI + 0x28), *(int *)(lVar1 + 0x1c) == in_RSI->iTable)) &&
     (-1 < in_RSI->iColumn)) {
    BVar2 = sqlite3ExprColUsed(in_RSI);
    *(Bitmask *)(lVar1 + 0x20) = BVar2 | *(ulong *)(lVar1 + 0x20);
  }
  return 0;
}

Assistant:

static int recomputeColumnsUsedExpr(Walker *pWalker, Expr *pExpr){
  SrcItem *pItem;
  if( pExpr->op!=TK_COLUMN ) return WRC_Continue;
  pItem = pWalker->u.pSrcItem;
  if( pItem->iCursor!=pExpr->iTable ) return WRC_Continue;
  if( pExpr->iColumn<0 ) return WRC_Continue;
  pItem->colUsed |= sqlite3ExprColUsed(pExpr);
  return WRC_Continue;
}